

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_int.c
# Opt level: O2

char mpt_type_uint(size_t len)

{
  char cVar1;
  
  cVar1 = (char)(0x7400000075007179 >> ((char)(len - 1) * '\b' & 0x3fU));
  if (7 < len - 1) {
    cVar1 = '\0';
  }
  return cVar1;
}

Assistant:

extern char mpt_type_uint(size_t len)
{
	switch (len) {
	  case sizeof(uint8_t):  return 'y';
	  case sizeof(uint16_t): return 'q';
	  case sizeof(uint32_t): return 'u';
	  case sizeof(uint64_t): return 't';
	  default: return 0;
	}
}